

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void uv__signal_event(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uint *puVar1;
  uv_signal_t *handle;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ssize_t sVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  char buf [512];
  undefined8 local_238;
  int aiStack_230 [128];
  
  uVar8 = 0;
  uVar9 = 0;
  do {
    sVar5 = read(loop->signal_pipefd[0],(void *)((long)aiStack_230 + (uVar9 - 8)),0x200 - uVar9);
    if ((int)sVar5 == -1) {
      piVar6 = __errno_location();
      if (*piVar6 != 4) {
        if (*piVar6 != 0xb) {
          abort();
        }
        if (uVar9 == 0) {
          return;
        }
      }
    }
    else {
      uVar9 = (long)(int)sVar5 + uVar9;
      uVar8 = uVar9 & 0xfffffffffffffff0;
      if (uVar8 != 0) {
        uVar7 = 0;
        do {
          handle = *(uv_signal_t **)((long)aiStack_230 + (uVar7 - 8));
          if (*(int *)((long)aiStack_230 + uVar7) == handle->signum) {
            if ((handle->flags & 1) != 0) {
              __assert_fail("!(handle->flags & UV_HANDLE_CLOSING)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/signal.c"
                            ,0x1d3,"void uv__signal_event(uv_loop_t *, uv__io_t *, unsigned int)");
            }
            (*handle->signal_cb)(handle,*(int *)((long)aiStack_230 + uVar7));
          }
          uVar3 = handle->dispatched_signals + 1;
          handle->dispatched_signals = uVar3;
          if ((handle->flags & 0x2000000) != 0) {
            uv__signal_stop(handle);
            uVar3 = handle->dispatched_signals;
          }
          if (handle->caught_signals == uVar3) {
            uVar3 = handle->flags;
            if ((uVar3 & 4) != 0 && handle->signum == 0) {
              uVar4 = uVar3 & 0xfffffffb;
              handle->flags = uVar4;
              uVar2 = uVar3 & 8;
              uVar3 = uVar4;
              if (uVar2 != 0) {
                puVar1 = &handle->loop->active_handles;
                *puVar1 = *puVar1 - 1;
              }
            }
            if ((uVar3 & 1) != 0) {
              uv__make_close_pending((uv_handle_t *)handle);
            }
          }
          uVar7 = uVar7 + 0x10;
        } while (uVar7 < uVar8);
      }
      uVar9 = uVar9 & 0xf;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        memmove(&local_238,(void *)((long)aiStack_230 + (uVar8 - 8)),uVar9);
      }
    }
    bVar10 = uVar8 != 0x200;
    uVar8 = 0x200;
    if (bVar10) {
      return;
    }
  } while( true );
}

Assistant:

static void uv__signal_event(uv_loop_t* loop,
                             uv__io_t* w,
                             unsigned int events) {
  uv__signal_msg_t* msg;
  uv_signal_t* handle;
  char buf[sizeof(uv__signal_msg_t) * 32];
  size_t bytes, end, i;
  int r;

  bytes = 0;
  end = 0;

  do {
    r = read(loop->signal_pipefd[0], buf + bytes, sizeof(buf) - bytes);

    if (r == -1 && errno == EINTR)
      continue;

    if (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)) {
      /* If there are bytes in the buffer already (which really is extremely
       * unlikely if possible at all) we can't exit the function here. We'll
       * spin until more bytes are read instead.
       */
      if (bytes > 0)
        continue;

      /* Otherwise, there was nothing there. */
      return;
    }

    /* Other errors really should never happen. */
    if (r == -1)
      abort();

    bytes += r;

    /* `end` is rounded down to a multiple of sizeof(uv__signal_msg_t). */
    end = (bytes / sizeof(uv__signal_msg_t)) * sizeof(uv__signal_msg_t);

    for (i = 0; i < end; i += sizeof(uv__signal_msg_t)) {
      msg = (uv__signal_msg_t*) (buf + i);
      handle = msg->handle;

      if (msg->signum == handle->signum) {
        assert(!(handle->flags & UV_HANDLE_CLOSING));
        handle->signal_cb(handle, handle->signum);
      }

      handle->dispatched_signals++;

      if (handle->flags & UV_SIGNAL_ONE_SHOT)
        uv__signal_stop(handle);

      /* If uv_close was called while there were caught signals that were not
       * yet dispatched, the uv__finish_close was deferred. Make close pending
       * now if this has happened.
       */
      if (handle->caught_signals == handle->dispatched_signals) {
        if (handle->signum == 0)
          uv__handle_stop(handle);
        if (handle->flags & UV_HANDLE_CLOSING)
          uv__make_close_pending((uv_handle_t*) handle);
      }
    }

    bytes -= end;

    /* If there are any "partial" messages left, move them to the start of the
     * the buffer, and spin. This should not happen.
     */
    if (bytes) {
      memmove(buf, buf + end, bytes);
      continue;
    }
  } while (end == sizeof buf);
}